

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qregularexpression.cpp
# Opt level: O3

QRegularExpressionMatch __thiscall
QRegularExpression::match
          (QRegularExpression *this,QString *subject,qsizetype offset,MatchType matchType,
          MatchOptions matchOptions)

{
  storage_type_conflict *psVar1;
  qsizetype qVar2;
  QRegularExpressionPrivate *pQVar3;
  Data *pDVar4;
  QRegularExpressionMatchPrivate *priv;
  undefined4 in_register_0000000c;
  qsizetype qVar5;
  storage_type_conflict *psVar6;
  QFlagsStorage<QRegularExpression::MatchOption> in_R9D;
  
  QRegularExpressionPrivate::compilePattern((QRegularExpressionPrivate *)(subject->d).d);
  priv = (QRegularExpressionMatchPrivate *)operator_new(0x60);
  psVar1 = *(storage_type_conflict **)(offset + 8);
  qVar2 = *(qsizetype *)(offset + 0x10);
  (priv->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value =
       (Type)0x0;
  pQVar3 = (QRegularExpressionPrivate *)(subject->d).d;
  (priv->regularExpression).d.d.ptr = pQVar3;
  qVar5 = qVar2;
  psVar6 = psVar1;
  if (pQVar3 != (QRegularExpressionPrivate *)0x0) {
    LOCK();
    (pQVar3->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value = (Type)((int)(pQVar3->super_QSharedData).ref.super_QAtomicInteger<int>.
                           super_QBasicAtomicInteger<int>._q_value + 1);
    UNLOCK();
    psVar6 = *(storage_type_conflict **)(offset + 8);
    qVar5 = *(qsizetype *)(offset + 0x10);
  }
  pDVar4 = *(Data **)offset;
  (priv->subjectStorage).d.d = pDVar4;
  (priv->subjectStorage).d.ptr = psVar6;
  (priv->subjectStorage).d.size = qVar5;
  if (pDVar4 != (Data *)0x0) {
    LOCK();
    (pDVar4->super_QArrayData).ref_ =
         (QBasicAtomicInt)(*(int *)&(pDVar4->super_QArrayData).ref_ + 1);
    UNLOCK();
  }
  (priv->subject).m_data = psVar1;
  (priv->subject).m_size = qVar2;
  priv->matchType =
       (MatchType)
       matchOptions.super_QFlagsStorageHelper<QRegularExpression::MatchOption,_4>.
       super_QFlagsStorage<QRegularExpression::MatchOption>.i;
  (priv->matchOptions).super_QFlagsStorageHelper<QRegularExpression::MatchOption,_4>.
  super_QFlagsStorage<QRegularExpression::MatchOption>.i = in_R9D.i;
  (priv->capturedOffsets).d.d = (Data *)0x0;
  (priv->capturedOffsets).d.ptr = (longlong *)0x0;
  *(undefined8 *)((long)&(priv->capturedOffsets).d.ptr + 7) = 0;
  *(undefined8 *)((long)&(priv->capturedOffsets).d.size + 7) = 0;
  QRegularExpressionPrivate::doMatch
            ((QRegularExpressionPrivate *)(subject->d).d,priv,
             CONCAT44(in_register_0000000c,matchType),CheckSubjectString,
             (QRegularExpressionMatchPrivate *)0x0);
  (this->d).d.ptr = (QRegularExpressionPrivate *)priv;
  LOCK();
  (priv->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value =
       (Type)((int)(priv->super_QSharedData).ref.super_QAtomicInteger<int>.
                   super_QBasicAtomicInteger<int>._q_value + 1);
  UNLOCK();
  return (QExplicitlySharedDataPointer<QRegularExpressionMatchPrivate>)
         (QExplicitlySharedDataPointer<QRegularExpressionMatchPrivate>)this;
}

Assistant:

QRegularExpressionMatch QRegularExpression::match(const QString &subject,
                                                  qsizetype offset,
                                                  MatchType matchType,
                                                  MatchOptions matchOptions) const
{
    d.data()->compilePattern();
    auto priv = new QRegularExpressionMatchPrivate(*this,
                                                   subject,
                                                   QStringView(subject),
                                                   matchType,
                                                   matchOptions);
    d->doMatch(priv, offset);
    return QRegularExpressionMatch(*priv);
}